

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

int __thiscall
NULLCFile::FileWriteArr(NULLCFile *this,NULLCArray arr,uint offset,uint count,File *file)

{
  FILE *__s;
  size_t sVar1;
  char *error;
  undefined4 in_register_00000084;
  
  if (CONCAT44(in_register_00000084,count) == 0) {
    error = "ERROR: null pointer access";
  }
  else {
    __s = *(FILE **)(CONCAT44(in_register_00000084,count) + 4);
    if (__s != (FILE *)0x0) {
      if ((ulong)(uint)arr.ptr < (ulong)offset + (ulong)arr.len) {
        nullcThrowError("Array doesn\'t contain %d bytes from the specified offset.",(ulong)offset);
        return 0;
      }
      if (this != (NULLCFile *)0x0) {
        sVar1 = fwrite(this + arr.len,1,(ulong)offset,__s);
        return (int)sVar1;
      }
      return 0;
    }
    error = "Cannot write to a closed file.";
  }
  nullcThrowError(error);
  return 0;
}

Assistant:

int FileWriteArr(NULLCArray arr, unsigned offset, unsigned count, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		if((long long)count + offset > arr.len)
		{
			nullcThrowError("Array doesn't contain %d bytes from the specified offset.", count);
			return 0;
		}

		return arr.ptr ? int(fwrite(arr.ptr + offset, 1, count, file->handle)) : 0;
	}